

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_integer_digit_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  parser<pstore::json::null_output> *parser_00;
  int iVar1;
  error_code local_38;
  ulong local_28;
  uint64_t new_acc;
  bool match;
  parser<pstore::json::null_output> *ppStack_18;
  char c_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  new_acc._7_1_ = c;
  ppStack_18 = parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  iVar1 = matcher<pstore::json::null_output>::get_state
                    (&this->super_matcher<pstore::json::null_output>);
  parser_00 = ppStack_18;
  if (iVar1 != 4) {
    assert_failed("this->get_state () == integer_digit_state",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2d6);
  }
  if (((this->super_matcher<pstore::json::null_output>).field_0xd & 1) == 0) {
    assert_failed("is_integer_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2d7);
  }
  new_acc._6_1_ = 1;
  if (new_acc._7_1_ == '.') {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,6)
    ;
    number_is_float(this);
  }
  else if ((new_acc._7_1_ == 'e') || (new_acc._7_1_ == 'E')) {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,8)
    ;
    number_is_float(this);
  }
  else if ((new_acc._7_1_ < '0') || ('9' < new_acc._7_1_)) {
    new_acc._6_1_ = 0;
    complete(this,ppStack_18);
  }
  else {
    local_28 = this->int_acc_ * 10 + (ulong)((int)new_acc._7_1_ - 0x30);
    if (local_28 < this->int_acc_) {
      std::error_code::error_code<pstore::json::error_code,void>(&local_38,number_out_of_range);
      matcher<pstore::json::null_output>::set_error
                (&this->super_matcher<pstore::json::null_output>,parser_00,&local_38);
    }
    else {
      this->int_acc_ = local_28;
    }
  }
  return (bool)(new_acc._6_1_ & 1);
}

Assistant:

bool number_matcher<Callbacks>::do_integer_digit_state (parser<Callbacks> & parser,
                                                                    char const c) {
                PSTORE_ASSERT (this->get_state () == integer_digit_state);
                PSTORE_ASSERT (is_integer_);

                bool match = true;
                if (c == '.') {
                    this->set_state (frac_initial_digit_state);
                    number_is_float ();
                } else if (c == 'e' || c == 'E') {
                    this->set_state (exponent_sign_state);
                    number_is_float ();
                } else if (c >= '0' && c <= '9') {
                    std::uint64_t const new_acc = int_acc_ * 10U + static_cast<unsigned> (c - '0');
                    if (new_acc < int_acc_) { // Did this overflow?
                        this->set_error (parser, error_code::number_out_of_range);
                    } else {
                        int_acc_ = new_acc;
                    }
                } else {
                    match = false;
                    this->complete (parser);
                }
                return match;
            }